

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O1

ssize_t __thiscall
LASreadItemCompressed_RGB14_v4::read
          (LASreadItemCompressed_RGB14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  uint *puVar9;
  int iVar10;
  U16 *item;
  
  puVar9 = (uint *)CONCAT44(in_register_00000034,__fd);
  item = this->contexts[this->current_context].last_item;
  uVar1 = *__buf;
  if (this->current_context != uVar1) {
    this->current_context = uVar1;
    if (this->contexts[uVar1].unused == true) {
      createAndInitModelsAndDecompressors(this,uVar1,(U8 *)item);
    }
    item = this->contexts[this->current_context].last_item;
  }
  if (this->changed_RGB == true) {
    UVar2 = ArithmeticDecoder::decodeSymbol
                      (this->dec_RGB,this->contexts[this->current_context].m_byte_used);
    if ((UVar2 & 1) == 0) {
      uVar8 = (uint)(byte)*item;
    }
    else {
      UVar3 = ArithmeticDecoder::decodeSymbol
                        (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_0);
      uVar1 = (UVar3 & 0xff) + (uint)(byte)*item;
      uVar8 = ((UVar3 & 0xff) - 0x100) + (uint)(byte)*item;
      if (uVar1 < 0x100) {
        uVar8 = uVar1;
      }
    }
    *(ushort *)puVar9 = (ushort)uVar8;
    if ((UVar2 & 2) == 0) {
      uVar6 = *item;
    }
    else {
      UVar3 = ArithmeticDecoder::decodeSymbol
                        (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_1);
      uVar8 = (uint)(ushort)*puVar9;
      uVar6 = (short)(UVar3 << 8) + *item;
    }
    uVar6 = (ushort)uVar8 | uVar6 & 0xff00;
    *(ushort *)puVar9 = uVar6;
    if ((UVar2 & 0x40) == 0) {
      *(ushort *)((long)puVar9 + 2) = uVar6;
      *(ushort *)(puVar9 + 1) = uVar6;
    }
    else {
      iVar10 = (uVar8 & 0xff) - (uint)(byte)*item;
      if ((UVar2 & 4) == 0) {
        uVar6 = (ushort)(byte)item[1];
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_2);
        uVar8 = (uint)(byte)item[1] + iVar10;
        uVar1 = uVar8 & 0xff;
        if (0xfe < (int)uVar8) {
          uVar1 = 0xff;
        }
        uVar4 = 0;
        if (0 < (int)uVar8) {
          uVar4 = uVar1;
        }
        uVar1 = uVar4 + (UVar3 & 0xff);
        uVar6 = (short)uVar4 + -0x100 + (short)(UVar3 & 0xff);
        if (uVar1 < 0x100) {
          uVar6 = (ushort)uVar1;
        }
      }
      *(ushort *)((long)puVar9 + 2) = uVar6;
      if ((UVar2 & 0x10) == 0) {
        uVar6 = (ushort)(byte)item[2];
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_4);
        uVar8 = (uint)(byte)item[2] +
                (int)((iVar10 + (uint)*(byte *)((long)puVar9 + 2)) - (uint)(byte)item[1]) / 2;
        uVar1 = uVar8 & 0xff;
        if (0xfe < (int)uVar8) {
          uVar1 = 0xff;
        }
        uVar4 = 0;
        if (0 < (int)uVar8) {
          uVar4 = uVar1;
        }
        uVar1 = uVar4 + (UVar3 & 0xff);
        uVar6 = (short)uVar4 + -0x100 + (short)(UVar3 & 0xff);
        if (uVar1 < 0x100) {
          uVar6 = (ushort)uVar1;
        }
      }
      *(ushort *)(puVar9 + 1) = uVar6;
      iVar10 = (uint)*(byte *)((long)puVar9 + 1) - (uint)*(byte *)((long)item + 1);
      if ((UVar2 & 8) == 0) {
        *(ushort *)((long)puVar9 + 2) =
             *(ushort *)((long)puVar9 + 2) | (ushort)*(byte *)((long)item + 3) << 8;
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_3);
        iVar5 = (uint)*(byte *)((long)item + 3) + iVar10;
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        iVar7 = 0;
        if (0 < iVar5) {
          iVar7 = iVar5;
        }
        *(ushort *)((long)puVar9 + 2) =
             *(ushort *)((long)puVar9 + 2) | ((short)iVar7 + (short)UVar3) * 0x100;
      }
      if ((UVar2 & 0x20) == 0) {
        *(ushort *)(puVar9 + 1) = (ushort)puVar9[1] | (ushort)*(byte *)((long)item + 5) << 8;
      }
      else {
        UVar2 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_5);
        iVar10 = (uint)*(byte *)((long)item + 5) +
                 (int)((iVar10 + (uint)*(byte *)((long)puVar9 + 3)) -
                      (uint)*(byte *)((long)item + 3)) / 2;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        iVar5 = 0;
        if (0 < iVar10) {
          iVar5 = iVar10;
        }
        *(ushort *)(puVar9 + 1) = (ushort)puVar9[1] | ((short)iVar5 + (short)UVar2) * 0x100;
      }
    }
    item[2] = (ushort)puVar9[1];
    uVar1 = *puVar9;
    *(uint *)item = uVar1;
  }
  else {
    *(U16 *)(puVar9 + 1) = item[2];
    uVar1 = *(uint *)item;
    *puVar9 = uVar1;
  }
  return (ulong)uVar1;
}

Assistant:

inline void LASreadItemCompressed_RGB14_v4::read(U8* item, U32& context)
{
  // get last

  U16* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, (U8*)last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_RGB)
  {
    U8 corr;
    I32 diff = 0;
    U32 sym = dec_RGB->decodeSymbol(contexts[current_context].m_byte_used);
    if (sym & (1 << 0))
    {
      corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_0);
      ((U16*)item)[0] = (U16)U8_FOLD(corr + (last_item[0]&255));
    }
    else 
    {
      ((U16*)item)[0] = last_item[0]&0xFF;
    }
    if (sym & (1 << 1))
    {
      corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_1);
      ((U16*)item)[0] |= (((U16)U8_FOLD(corr + (last_item[0]>>8))) << 8);
    }
    else
    {
      ((U16*)item)[0] |= (last_item[0]&0xFF00);
    }
    if (sym & (1 << 6))
    {
      diff = (((U16*)item)[0]&0x00FF) - (last_item[0]&0x00FF);
      if (sym & (1 << 2))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_2);
        ((U16*)item)[1] = (U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[1]&255)));
      }
      else
      {
        ((U16*)item)[1] = last_item[1]&0xFF;
      }
      if (sym & (1 << 4))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_4);
        diff = (diff + ((((U16*)item)[1]&0x00FF) - (last_item[1]&0x00FF))) / 2;
        ((U16*)item)[2] = (U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[2]&255)));
      }
      else
      {
        ((U16*)item)[2] = last_item[2]&0xFF;
      }
      diff = (((U16*)item)[0]>>8) - (last_item[0]>>8);
      if (sym & (1 << 3))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_3);
        ((U16*)item)[1] |= (((U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[1]>>8))))<<8);
      }
      else
      {
        ((U16*)item)[1] |= (last_item[1]&0xFF00);
      }
      if (sym & (1 << 5))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_5);
        diff = (diff + ((((U16*)item)[1]>>8) - (last_item[1]>>8))) / 2;
        ((U16*)item)[2] |= (((U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[2]>>8))))<<8);
      }
      else
      {
        ((U16*)item)[2] |= (last_item[2]&0xFF00);
      }
    }
    else
    {
      ((U16*)item)[1] = ((U16*)item)[0];
      ((U16*)item)[2] = ((U16*)item)[0];
    }
    memcpy(last_item, item, 6);
  }
  else
  {
    memcpy(item, last_item, 6);
  }
}